

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__input____InputLocalOffset
          (ColladaParserAutoGen14Private *this)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__input____InputLocalOffset()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__input____InputLocalOffset();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}